

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O3

void duckdb::ListRangeFunction<duckdb::NumericRangeInfo,true>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  byte bVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  bool bVar7;
  reference pvVar8;
  uint64_t uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  Vector *pVVar12;
  long lVar13;
  long lVar14;
  idx_t iVar15;
  idx_t iVar16;
  long lVar17;
  idx_t iVar18;
  idx_t idx_in_entry;
  ulong uVar19;
  long lVar20;
  uint64_t *puVar21;
  long lVar22;
  size_type __n;
  idx_t required_capacity;
  INCREMENT_TYPE *data_1;
  RangeInfoStruct<duckdb::NumericRangeInfo,_true> info;
  VectorType local_14c;
  element_type *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  SelectionVector *local_128;
  data_ptr_t local_120;
  idx_t local_118;
  RangeInfoStruct<duckdb::NumericRangeInfo,_true> local_110;
  
  RangeInfoStruct<duckdb::NumericRangeInfo,_true>::RangeInfoStruct(&local_110,args);
  iVar18 = 1;
  local_14c = CONSTANT_VECTOR;
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar8 = vector<duckdb::Vector,_true>::operator[](&args->data,__n);
      if (pvVar8->vector_type != CONSTANT_VECTOR) {
        iVar18 = args->count;
        local_14c = FLAT_VECTOR;
        break;
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(args->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  pdVar1 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (iVar18 == 0) {
    required_capacity = 0;
  }
  else {
    puVar21 = (uint64_t *)(pdVar1 + 8);
    uVar19 = 0;
    required_capacity = 0;
    do {
      bVar7 = RangeInfoStruct<duckdb::NumericRangeInfo,_true>::RowIsValid(&local_110,uVar19);
      if (bVar7) {
        puVar21[-1] = required_capacity;
        uVar9 = RangeInfoStruct<duckdb::NumericRangeInfo,_true>::ListLength(&local_110,uVar19);
        *puVar21 = uVar9;
        required_capacity = required_capacity + uVar9;
      }
      else {
        _Var11._M_head_impl =
             (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var11._M_head_impl == (unsigned_long *)0x0) {
          local_118 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_138,&local_118);
          _Var6._M_pi = _Stack_130._M_pi;
          peVar5 = local_138;
          local_138 = (element_type *)0x0;
          _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar5;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = _Var6._M_pi;
          if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
             _Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_130._M_pi);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var11._M_head_impl =
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var11._M_head_impl;
        }
        bVar4 = (byte)uVar19 & 0x3f;
        _Var11._M_head_impl[uVar19 >> 6] =
             _Var11._M_head_impl[uVar19 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4)
        ;
        puVar21[-1] = required_capacity;
        *puVar21 = 0;
      }
      uVar19 = uVar19 + 1;
      puVar21 = puVar21 + 2;
    } while (iVar18 != uVar19);
  }
  ListVector::Reserve(result,required_capacity);
  pVVar12 = ListVector::GetEntry(result);
  if (iVar18 != 0) {
    pdVar2 = pVVar12->data;
    lVar14 = (long)((local_110.args)->data).
                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)((local_110.args)->data).
                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_120 = local_110.vdata[2].data;
    local_128 = local_110.vdata[2].sel;
    iVar16 = 0;
    lVar17 = 0;
    do {
      lVar13 = 1;
      if (lVar14 == 0x68) {
        lVar20 = 0;
      }
      else {
        iVar15 = iVar16;
        if ((local_110.vdata[0].sel)->sel_vector != (sel_t *)0x0) {
          iVar15 = (idx_t)(local_110.vdata[0].sel)->sel_vector[iVar16];
        }
        lVar20 = *(long *)(local_110.vdata[0].data + iVar15 * 8);
        if (2 < (ulong)((lVar14 >> 3) * 0x4ec4ec4ec4ec4ec5)) {
          iVar15 = iVar16;
          if ((local_110.vdata[2].sel)->sel_vector != (sel_t *)0x0) {
            iVar15 = (idx_t)(local_110.vdata[2].sel)->sel_vector[iVar16];
          }
          lVar13 = *(long *)(local_110.vdata[2].data + iVar15 * 8);
        }
      }
      if (*(long *)(pdVar1 + iVar16 * 0x10 + 8) != 0) {
        uVar19 = 0;
        do {
          lVar22 = lVar13;
          if (uVar19 == 0) {
            lVar22 = 0;
          }
          lVar20 = lVar20 + lVar22;
          *(long *)(pdVar2 + uVar19 * 8 + lVar17 * 8) = lVar20;
          uVar19 = uVar19 + 1;
        } while (uVar19 < *(ulong *)(pdVar1 + iVar16 * 0x10 + 8));
        lVar17 = lVar17 + uVar19;
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 != iVar18);
  }
  ListVector::SetListSize(result,required_capacity);
  Vector::SetVectorType(result,local_14c);
  Vector::Verify(result,args->count);
  lVar14 = 0xd8;
  do {
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_110.vdata + lVar14 + -8)
    ;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&_Stack_130._M_pi + lVar14);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    lVar14 = lVar14 + -0x48;
  } while (lVar14 != 0);
  return;
}

Assistant:

static void ListRangeFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);

	RangeInfoStruct<OP, INCLUSIVE_BOUND> info(args);
	idx_t args_size = 1;
	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			args_size = args.size();
			result_type = VectorType::FLAT_VECTOR;
			break;
		}
	}
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_validity = FlatVector::Validity(result);
	uint64_t total_size = 0;
	for (idx_t i = 0; i < args_size; i++) {
		if (!info.RowIsValid(i)) {
			result_validity.SetInvalid(i);
			list_data[i].offset = total_size;
			list_data[i].length = 0;
		} else {
			list_data[i].offset = total_size;
			list_data[i].length = info.ListLength(i);
			total_size += list_data[i].length;
		}
	}

	// now construct the child vector of the list
	ListVector::Reserve(result, total_size);
	auto range_data = FlatVector::GetData<typename OP::TYPE>(ListVector::GetEntry(result));
	idx_t total_idx = 0;
	for (idx_t i = 0; i < args_size; i++) {
		typename OP::TYPE start_value = info.StartListValue(i);
		typename OP::INCREMENT_TYPE increment = info.ListIncrementValue(i);

		typename OP::TYPE range_value = start_value;
		for (idx_t range_idx = 0; range_idx < list_data[i].length; range_idx++) {
			if (range_idx > 0) {
				OP::Increment(range_value, increment);
			}
			range_data[total_idx++] = range_value;
		}
	}

	ListVector::SetListSize(result, total_size);
	result.SetVectorType(result_type);

	result.Verify(args.size());
}